

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_3a70a8::PrefixExpr::printLeft(PrefixExpr *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  
  OutputStream::operator+=(S,this->Prefix);
  R.Last = "";
  R.First = "(";
  OutputStream::operator+=(S,R);
  Node::print(this->Child,S);
  R_00.Last = "";
  R_00.First = ")";
  OutputStream::operator+=(S,R_00);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += Prefix;
    S += "(";
    Child->print(S);
    S += ")";
  }